

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

void __thiscall
iutest::AssertionHelper::OnFixed(AssertionHelper *this,Fixed *fixed,bool isException)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  ScopedTrace *this_00;
  TestPartResultReporterInterface *pTVar4;
  bool local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string append_message;
  bool isException_local;
  Fixed *fixed_local;
  AssertionHelper *this_local;
  
  append_message.field_2._M_local_buf[0xf] = isException;
  detail::iuStreamMessage::GetString_abi_cxx11_((string *)local_40,&fixed->super_Message);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_60," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    detail::iuCodeMessage::add_message((iuCodeMessage *)this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  this_00 = ScopedTrace::GetInstance();
  ScopedTrace::append_message
            (this_00,&this->m_part_result,(bool)(append_message.field_2._M_local_buf[0xf] & 1));
  pTVar4 = TestEnv::GetGlobalTestPartResultReporter();
  if (pTVar4 == (TestPartResultReporterInterface *)0x0) {
    detail::DefaultReportTestPartResult(&this->m_part_result);
  }
  else {
    pTVar4 = TestEnv::GetGlobalTestPartResultReporter();
    (*pTVar4->_vptr_TestPartResultReporterInterface[2])(pTVar4,this);
  }
  bVar2 = TestPartResult::failed(&this->m_part_result);
  local_99 = false;
  if (bVar2) {
    local_99 = TestFlag::IsEnableFlag(0x10);
  }
  if (local_99 != false) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void OnFixed(const Fixed& fixed, bool isException = false)
    {
        // OnFixed で throw しないこと！テスト側の例外キャッチにかからなくなる
        const ::std::string append_message = fixed.GetString();
        if( !append_message.empty() )
        {
            m_part_result.add_message(" " + append_message);
        }
        ScopedTrace::GetInstance().append_message(m_part_result, isException);

        if( TestEnv::GetGlobalTestPartResultReporter() != IUTEST_NULLPTR )
        {
            TestEnv::GetGlobalTestPartResultReporter()->ReportTestPartResult(m_part_result);
        }
        else
        {
            detail::DefaultReportTestPartResult(m_part_result);
        }

        if IUTEST_COND_UNLIKELY(m_part_result.failed()
            && TestFlag::IsEnableFlag(iutest::TestFlag::BREAK_ON_FAILURE))
        {
            IUTEST_BREAK();
        }